

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O2

void mserialize::serialize<(anonymous_namespace)::Tree,OutputStream>(Tree *in,OutputStream *ostream)

{
  serialize<int,OutputStream>(&in->value,ostream);
  detail::BuiltinSerializer<(anonymous_namespace)::Tree_*,_void>::serialize<OutputStream>
            (&in->left,ostream);
  detail::BuiltinSerializer<(anonymous_namespace)::Tree_*,_void>::serialize<OutputStream>
            (&in->right,ostream);
  return;
}

Assistant:

void serialize(const T& in, OutputStream& ostream)
{
  detail::Serializer<T>::type::serialize(in, ostream);
}